

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O1

QSize __thiscall
QStyleSheetStyle::sizeFromContents
          (QStyleSheetStyle *this,ContentsType ct,QStyleOption *opt,QSize *csz,QWidget *w)

{
  QStyleSheetStyle *pQVar1;
  undefined1 auVar2 [8];
  undefined1 auVar3 [8];
  QVariant *pQVar4;
  bool bVar5;
  char cVar6;
  char cVar7;
  uint pseudoElement;
  int iVar8;
  int iVar9;
  QStyle *pQVar10;
  QSize QVar11;
  QSize QVar12;
  ulong uVar13;
  undefined8 uVar14;
  qsizetype qVar15;
  int iVar16;
  Representation RVar17;
  Representation RVar18;
  QPalettePrivate *pQVar19;
  undefined4 uVar20;
  uint uVar21;
  int iVar22;
  QStyleOption *pQVar23;
  QStyleOption *pQVar24;
  long lVar25;
  long in_FS_OFFSET;
  QRect QVar26;
  undefined1 auVar27 [16];
  QByteArrayView layout;
  QFontMetrics fm;
  QSize sz;
  QRenderRule subSubRule;
  QRenderRule rule;
  QRenderRule subRule;
  Representation local_218;
  QSize local_208;
  QSize local_200;
  undefined1 local_1f8 [8];
  QVariant *pQStack_1f0;
  undefined1 *puStack_1e8;
  undefined1 local_1d8 [8];
  QPalettePrivate *pQStack_1d0;
  undefined1 *local_1c8;
  QRenderRule local_150;
  undefined1 local_c8 [16];
  QFont local_b8 [16];
  bool local_a8;
  QHash<QString,_QVariant> local_a0;
  QSharedDataPointer<QStyleSheetPaletteData> local_98;
  QSharedDataPointer<QStyleSheetBoxData> local_90;
  QSharedDataPointer<QStyleSheetBackgroundData> local_88;
  QSharedDataPointer<QStyleSheetBorderData> local_80;
  QSharedDataPointer<QStyleSheetOutlineData> local_78;
  QSharedDataPointer<QStyleSheetGeometryData> local_70;
  QSharedDataPointer<QStyleSheetPositionData> local_68;
  QSharedDataPointer<QStyleSheetImageData> local_60;
  QSharedDataPointer<QStyleSheetImageData> local_58 [2];
  QPainterPath local_48 [16];
  long local_38;
  
  pQVar1 = globalStyleSheetStyle;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (globalStyleSheetStyle != (QStyleSheetStyle *)this &&
      globalStyleSheetStyle != (QStyleSheetStyle *)0x0) {
    pQVar10 = baseStyle(this);
    QVar11 = (QSize)(**(code **)(*(long *)pQVar10 + 0xe8))(pQVar10,ct,opt,csz,w);
    pQVar23 = (QStyleOption *)((ulong)QVar11 >> 0x20);
    goto LAB_00369edc;
  }
  if (globalStyleSheetStyle == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)this;
  }
  memset(&local_150,0xaa,0x88);
  renderRule(&local_150,this,&w->super_QObject,opt,0);
  local_200 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
  QVar11 = QRenderRule::adjustSize(&local_150,csz);
  local_200 = QVar11;
  switch(ct) {
  case CT_PushButton:
  case CT_ComboBox:
    goto switchD_00368921_caseD_0;
  case CT_CheckBox:
  case CT_RadioButton:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar23 = opt, opt->type != 2)) {
      pQVar23 = (QStyleOption *)0x0;
    }
    if ((pQVar23 == (QStyleOption *)0x0) ||
       ((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0 &&
         local_150.b.d.ptr == (QStyleSheetBoxData *)0x0 &&
        (bVar5 = hasStyleRule(this,&w->super_QObject,5), !bVar5)))) goto switchD_00368921_caseD_11;
    bVar5 = ct == CT_RadioButton;
    uVar20 = 0x43;
    if (bVar5) {
      uVar20 = 0x4a;
    }
    iVar8 = (**(code **)(*(long *)this + 0xe0))(this,bVar5 * '\x02' + '%',pQVar23,w);
    RVar17.m_i = (**(code **)(*(long *)this + 0xe0))(this,bVar5 * '\x02' + '&',pQVar23,w);
    iVar9 = (**(code **)(*(long *)this + 0xe0))(this,uVar20,pQVar23,w);
    if (RVar17.m_i < local_200.ht.m_i) {
      RVar17.m_i = local_200.ht.m_i;
    }
    local_200.ht.m_i = RVar17.m_i;
    local_200.wd.m_i = local_200.wd.m_i + iVar9 + iVar8;
    goto LAB_0036970d;
  case CT_ToolButton:
    if ((local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
       (((local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d
           ).ptr != (QStyleSheetBorderImageData *)0x0 ||
          (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) != BorderStyle_Native)))) ||
        (bVar5 = QRenderRule::baseStyleCanDraw(&local_150), !bVar5)))) {
      RVar17 = local_200.ht.m_i;
      local_200.wd.m_i = local_200.wd.m_i.m_i + 3;
      local_200.ht.m_i = RVar17.m_i + 3;
    }
    goto switchD_00368921_caseD_0;
  case CT_Splitter:
  case CT_MenuBarItem:
    iVar8 = 10;
    if (ct == CT_Splitter) {
      iVar8 = 0x20;
    }
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,iVar8);
    if (local_80.d.ptr != (QStyleSheetBorderData *)0x0 ||
        local_90.d.ptr != (QStyleSheetBoxData *)0x0) {
      QVar11 = QRenderRule::boxSize((QRenderRule *)local_c8,&local_200,7);
      QPainterPath::~QPainterPath(local_48);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_58);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_60);
      if (local_68.d.ptr != (QStyleSheetPositionData *)0x0) {
        LOCK();
        *(int *)local_68.d.ptr = *(int *)local_68.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_68.d.ptr == 0) && (local_68.d.ptr != (QStyleSheetPositionData *)0x0)) {
          operator_delete((void *)local_68.d.ptr,0x24);
        }
      }
      goto joined_r0x0036938a;
    }
LAB_00369bb9:
    QRenderRule::~QRenderRule((QRenderRule *)local_c8);
  default:
switchD_00368921_caseD_11:
    pQVar10 = baseStyle(this);
    QVar11 = (QSize)(**(code **)(*(long *)pQVar10 + 0xe8))(pQVar10,ct,opt,&local_200,w);
    break;
  case CT_ProgressBar:
  case CT_SizeGrip:
    if (((local_150.geo.d.ptr == (QStyleSheetGeometryData *)0x0) ||
        ((*(int *)((long)local_150.geo.d.ptr + 0xc) == -1 &&
         (*(int *)((long)local_150.geo.d.ptr + 0x10) == -1)))) &&
       ((local_150.img.d.ptr == (QStyleSheetImageData *)0x0 ||
        (((((QSize *)((long)local_150.img.d.ptr + 0x14))->wd).m_i < 0 ||
         (((Representation *)((long)local_150.img.d.ptr + 0x18))->m_i < 0)))))) {
      pQVar10 = baseStyle(this);
      local_c8._0_8_ = (**(code **)(*(long *)pQVar10 + 0xe8))(pQVar10,ct,opt,&local_200,w);
      QVar11 = QRenderRule::boxSize(&local_150,(QSize *)local_c8,7);
    }
    else {
      QVar11 = QRenderRule::size(&local_150,&local_200);
    }
    break;
  case CT_MenuItem:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar23 = opt, opt->type != 4)) {
      pQVar23 = (QStyleOption *)0x0;
    }
    if (pQVar23 != (QStyleOption *)0x0) {
      iVar8 = pQVar23[1].version;
      iVar9 = 10;
      if (iVar8 == 2) {
        iVar9 = 0x26;
      }
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,iVar9);
      if (iVar8 == 2) {
        if (((local_70.d.ptr != (QStyleSheetGeometryData *)0x0) &&
            ((*(int *)((long)local_70.d.ptr + 0xc) != -1 ||
             (*(int *)((long)local_70.d.ptr + 0x10) != -1)))) ||
           ((local_60.d.ptr != (QStyleSheetImageData *)0x0 &&
            ((-1 < (((QSize *)((long)local_60.d.ptr + 0x14))->wd).m_i &&
             (-1 < ((Representation *)((long)local_60.d.ptr + 0x18))->m_i)))))) {
          QVar11 = (QSize)((ulong)local_200 & 0xffffffff);
          QVar12 = QRenderRule::size((QRenderRule *)local_c8);
LAB_0036a065:
          pQVar23 = (QStyleOption *)((ulong)QVar12 >> 0x20);
          goto LAB_0036a069;
        }
      }
      else if ((local_80.d.ptr != (QStyleSheetBorderData *)0x0 ||
                local_90.d.ptr != (QStyleSheetBoxData *)0x0) || (local_a8 == true)) {
        cVar6 = *(char *)((long)&pQVar23[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
                                 super_QFlagsStorage<QStyle::StateFlag>.i + 1);
        lVar25 = QMetaObject::cast((QObject *)&QComboBox::staticMetaObject);
        local_1f8 = *(undefined1 (*) [8])csz;
        if (local_a8 == true) {
          local_208 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
          QFont::resolve((QFont *)local_1d8);
          QFontMetrics::QFontMetrics((QFontMetrics *)&local_208,(QFont *)local_1d8);
          QFont::~QFont((QFont *)local_1d8);
          _local_1d8 = (QStringView)(ZEXT816(0xffffffffffffffff) << 0x40);
          auVar27 = QFontMetrics::boundingRect
                              ((QRect *)&local_208,(int)local_1d8,(QString *)0x900,
                               (int)pQVar23 + 0x60,(int *)0x0);
          RVar17.m_i = (auVar27._8_4_ - auVar27._0_4_) + 1;
          RVar18.m_i = (auVar27._12_4_ - auVar27._4_4_) + 1;
          if (RVar17.m_i < (int)local_1f8._0_4_) {
            RVar17.m_i = local_1f8._0_4_;
          }
          if (RVar18.m_i < (int)local_1f8._4_4_) {
            RVar18.m_i = local_1f8._4_4_;
          }
          local_1f8._4_4_ = RVar18.m_i;
          local_1f8._0_4_ = RVar17.m_i;
          QFontMetrics::~QFontMetrics((QFontMetrics *)&local_208);
        }
        pQStack_1d0 = pQVar23[1].palette.d;
        local_1d8._0_4_ = pQVar23[1].palette.currentGroup;
        local_1d8._4_4_ = *(undefined4 *)&pQVar23[1].palette.field_0xc;
        qVar15 = QStringView::indexOf((QStringView *)local_1d8,(QChar)0x9,0,CaseSensitive);
        if (qVar15 != -1) {
          local_1f8._0_4_ = local_1f8._0_4_ + 0xc;
        }
        cVar7 = QIcon::isNull();
        if (cVar7 == '\0') {
          local_1d8._4_4_ = (**(code **)(*(long *)this + 0xe0))(this,0x3e,0,0);
          local_1d8._0_4_ = local_1d8._4_4_;
          iVar8 = QIcon::actualSize((QSize *)&pQVar23[1].styleObject,(Mode)local_1d8,On);
          if (iVar8 < pQVar23[2].version) {
            iVar8 = pQVar23[2].version;
          }
          local_1f8._0_4_ = iVar8 + local_1f8._0_4_ + 4;
        }
        else if ((lVar25 == 0) && (cVar6 != '\0')) {
          memset((QRenderRule *)local_1d8,0xaa,0x88);
          renderRule((QRenderRule *)local_1d8,this,&w->super_QObject,opt,0x25);
          QVar26 = positionRect(this,w,(QRenderRule *)local_c8,(QRenderRule *)local_1d8,0x25,
                                &opt->rect,opt->direction);
          iVar8 = (QVar26.x2.m_i.m_i - QVar26.x1.m_i) + 1;
          if (iVar8 < pQVar23[2].version) {
            iVar8 = pQVar23[2].version;
          }
          local_1f8._0_4_ = local_1f8._0_4_ + iVar8 + 4;
          QRenderRule::~QRenderRule((QRenderRule *)local_1d8);
        }
        else {
          local_1f8._0_4_ = local_1f8._0_4_ + pQVar23[2].version;
        }
        QVar11 = QRenderRule::adjustSize((QRenderRule *)local_c8,(QSize *)local_1f8);
        local_1d8._0_4_ = QVar11.wd.m_i;
        local_1d8._4_4_ = QVar11.ht.m_i;
        QVar11 = QRenderRule::boxSize((QRenderRule *)local_c8,(QSize *)local_1d8,7);
        QVar12 = QVar11;
        goto LAB_0036a065;
      }
      goto LAB_00369bb9;
    }
    goto switchD_00368921_caseD_11;
  case CT_MenuBar:
  case CT_Menu:
  case CT_ScrollBar:
    if (local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0 &&
        local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) goto switchD_00368921_caseD_11;
    break;
  case CT_TabBarTab:
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x2e);
    if (((local_90.d.ptr == (QStyleSheetBoxData *)0x0) &&
        ((local_80.d.ptr == (QStyleSheetBorderData *)0x0 ||
         (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_80.d.ptr + 0x68))->d).
           ptr == (QStyleSheetBorderImageData *)0x0 &&
          (*(BorderStyle *)((long)local_80.d.ptr + 0x38) == BorderStyle_Native)))))) &&
       (local_a8 != true)) {
      local_200 = QRenderRule::adjustSize((QRenderRule *)local_c8,csz);
      goto LAB_00369bb9;
    }
    local_1d8 = (undefined1  [8])0x0;
    pQStack_1d0 = (QPalettePrivate *)0x0;
    local_1c8 = (undefined1 *)0x0;
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar23 = opt, opt->type != 3)) {
      pQVar23 = (QStyleOption *)0x0;
    }
    if (pQVar23 == (QStyleOption *)0x0) {
      bVar5 = false;
      iVar8 = 0;
    }
    else {
      cVar6 = QIcon::isNull();
      iVar8 = 0xc;
      if (cVar6 != '\0') {
        iVar8 = 0;
      }
      bVar5 = (pQVar23[1].version - 2U & 0xfffffffa) == 0;
      QString::operator=((QString *)local_1d8,(QString *)&pQVar23[1].state);
    }
    if ((local_90.d.ptr != (QStyleSheetBoxData *)0x0) ||
       ((local_80.d.ptr != (QStyleSheetBorderData *)0x0 &&
        (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_80.d.ptr + 0x68))->d).ptr
          != (QStyleSheetBorderImageData *)0x0 ||
         (*(BorderStyle *)((long)local_80.d.ptr + 0x38) != BorderStyle_Native)))))) {
      iVar9 = iVar8;
      if (bVar5 != false) {
        iVar9 = 0;
      }
      iVar16 = 0;
      if (bVar5 != false) {
        iVar16 = iVar8;
      }
      local_200.wd.m_i = iVar9 + (csz->wd).m_i;
      local_200.ht.m_i = iVar16 + (csz->ht).m_i;
    }
    if (local_a8 == true) {
      iVar8 = QFontMetrics::size((int)opt + 0x20,(QString *)0x800,(int)local_1d8,(int *)0x0);
      (&local_200.wd)[bVar5].m_i = (&local_200.wd)[bVar5].m_i - iVar8;
      local_1f8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      pQStack_1f0 = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
      QFont::resolve((QFont *)local_1f8);
      local_208 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QFontMetrics::QFontMetrics((QFontMetrics *)&local_208,(QFont *)local_1f8);
      uVar14 = QFontMetrics::size((int)(QFontMetrics *)&local_208,(QString *)0x800,(int)local_1d8,
                                  (int *)0x0);
      RVar17.m_i = (int)((ulong)uVar14 >> 0x20);
      if (bVar5 == false) {
        if (RVar17.m_i < local_200.ht.m_i) {
          RVar17.m_i = local_200.ht.m_i;
        }
        local_200.ht.m_i = RVar17.m_i;
        local_200.wd.m_i = local_200.wd.m_i + (int)uVar14;
      }
      else {
        if (RVar17.m_i < local_200.wd.m_i) {
          RVar17.m_i = local_200.wd.m_i;
        }
        local_200.ht.m_i = local_200.ht.m_i + (int)uVar14;
        local_200.wd.m_i = RVar17.m_i;
      }
      QFontMetrics::~QFontMetrics((QFontMetrics *)&local_208);
      QFont::~QFont((QFont *)local_1f8);
    }
    local_1f8 = (undefined1  [8])QRenderRule::adjustSize((QRenderRule *)local_c8,&local_200);
    QVar11 = QRenderRule::boxSize((QRenderRule *)local_c8,(QSize *)local_1f8,7);
    pQVar23 = (QStyleOption *)((ulong)QVar11 >> 0x20);
    if ((QSize)local_1d8 != (QSize)0x0) {
      LOCK();
      *(int *)local_1d8 = *(int *)local_1d8 + -1;
      UNLOCK();
      if (*(int *)local_1d8 == 0) {
        QArrayData::deallocate((QArrayData *)local_1d8,2,0x10);
      }
    }
LAB_0036a069:
    QRenderRule::~QRenderRule((QRenderRule *)local_c8);
    goto LAB_00369dd1;
  case CT_Slider:
    if (((local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0) ||
        (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0)) ||
       (local_150.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) goto LAB_0036970d;
    goto switchD_00368921_caseD_11;
  case CT_LineEdit:
  case CT_GroupBox:
    lVar25 = QMetaObject::cast((QObject *)&QAbstractSpinBox::staticMetaObject);
    if (lVar25 == 0) {
      if ((local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) ||
         ((local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0 &&
          (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->
            d).ptr != (QStyleSheetBorderImageData *)0x0 ||
           (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) != BorderStyle_Native))))))
      goto LAB_0036970d;
      goto switchD_00368921_caseD_11;
    }
    QVar11 = *csz;
    break;
  case CT_SpinBox:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) ||
       (pQVar23 = opt, opt->type != 0xf0002)) {
      pQVar23 = (QStyleOption *)0x0;
    }
    if (pQVar23 == (QStyleOption *)0x0) goto switchD_00368921_caseD_11;
    bVar5 = QRenderRule::baseStyleCanDraw(&local_150);
    if (bVar5) {
      pQVar10 = baseStyle(this);
      local_200 = (QSize)(**(code **)(*(long *)pQVar10 + 0xe8))(pQVar10,0xf,opt,&local_200,w);
    }
    else if (pQVar23[1].state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
             super_QFlagsStorage<QStyle::StateFlag>.i != 2) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0xb);
      bVar5 = QRenderRule::hasDrawable((QRenderRule *)local_c8);
      if (bVar5) {
        QVar26 = positionRect(this,w,&local_150,(QRenderRule *)local_c8,0xb,&opt->rect,
                              opt->direction);
        RVar17.m_i = ((QVar26.x2.m_i.m_i + local_200.wd.m_i) - QVar26.x1.m_i) + 1;
      }
      else {
        QVar11 = QRenderRule::size((QRenderRule *)local_c8);
        QVar11 = defaultSize(this,w,QVar11,&pQVar23->rect,0xb);
        RVar17.m_i = QVar11.wd.m_i.m_i + local_200.wd.m_i;
      }
      local_200.wd.m_i = RVar17.m_i;
      QRenderRule::~QRenderRule((QRenderRule *)local_c8);
    }
    QVar11 = local_200;
    if (local_150.bd.d.ptr != (QStyleSheetBorderData *)0x0 ||
        local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) {
      QVar11 = QRenderRule::boxSize(&local_150,&local_200,7);
      local_200 = QVar11;
    }
    break;
  case CT_HeaderSection:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar23 = opt, opt->type != 8)) {
      pQVar23 = (QStyleOption *)0x0;
    }
    if (pQVar23 != (QStyleOption *)0x0) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x2a);
      if ((local_90.d.ptr == (QStyleSheetBoxData *)0x0 &&
           local_70.d.ptr == (QStyleSheetGeometryData *)0x0) &&
         (((local_80.d.ptr == (QStyleSheetBorderData *)0x0 ||
           (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_80.d.ptr + 0x68))->d).
             ptr == (QStyleSheetBorderImageData *)0x0 &&
            (*(BorderStyle *)((long)local_80.d.ptr + 0x38) == BorderStyle_Native)))) &&
          (local_a8 != true)))) {
        bVar5 = QRenderRule::baseStyleCanDraw((QRenderRule *)local_c8);
        if (bVar5) {
          pQVar10 = baseStyle(this);
          local_200 = (QSize)(**(code **)(*(long *)pQVar10 + 0xe8))(pQVar10,0x13,opt,&local_200,w);
        }
        else {
          local_200 = QWindowsStyle::sizeFromContents
                                ((QWindowsStyle *)this,CT_HeaderSection,opt,&local_200,w);
        }
        bVar5 = hasStyleRule(this,&w->super_QObject,0x2c);
        if ((bVar5) ||
           (bVar5 = hasStyleRule(this,&w->super_QObject,0x2b), QVar11 = local_200,
           QVar12 = local_200, bVar5)) {
          auVar27 = (**(code **)(*(long *)this + 0xc0))(this,0x11,opt,w);
          if (pQVar23[2].version == 1) {
            local_200.wd.m_i = local_200.wd.m_i + (auVar27._8_4_ - auVar27._0_4_) + 1;
            QVar11 = local_200;
            QVar12 = local_200;
          }
          else {
            local_200.ht.m_i = local_200.ht.m_i + (auVar27._12_4_ - auVar27._4_4_) + 1;
            QVar11 = local_200;
            QVar12 = local_200;
          }
        }
      }
      else {
        local_200 = QRenderRule::adjustSize((QRenderRule *)local_c8,csz);
        if ((local_200.wd.m_i.m_i < 0) || ((long)local_200 < 0)) {
          pQVar10 = baseStyle(this);
          uVar14 = (**(code **)(*(long *)pQVar10 + 0xe8))(pQVar10,0x13,opt,&local_200,w);
          if (local_200.wd.m_i < 0) {
            local_200.wd.m_i = (int)uVar14;
          }
          if ((long)local_200 < 0) {
            local_200.ht.m_i = (int)((ulong)uVar14 >> 0x20);
          }
        }
        if (local_70.d.ptr == (QStyleSheetGeometryData *)0x0) {
          cVar6 = QIcon::isNull();
          iVar8 = (**(code **)(*(long *)this + 0xe0))(this,0x2e,pQVar23);
          iVar9 = 0;
          if (cVar6 == '\0') {
            iVar9 = (**(code **)(*(long *)this + 0xe0))(this,0x3e,pQVar23);
          }
          local_1f8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
          QFontMetrics::QFontMetrics((QFontMetrics *)local_1f8,&pQVar23->fontMetrics);
          if (local_a8 == true) {
            pQStack_1d0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
            local_1d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
            if (w == (QWidget *)0x0) {
              QFont::QFont((QFont *)local_1d8,local_b8);
            }
            else {
              QFont::resolve((QFont *)local_1d8);
            }
            QFontMetrics::QFontMetrics((QFontMetrics *)&local_208,(QFont *)local_1d8);
            auVar2 = local_1f8;
            local_1f8._0_4_ = local_208.wd.m_i;
            local_1f8._4_4_ = local_208.ht.m_i;
            auVar3 = local_1f8;
            local_1f8._0_4_ = auVar2._0_4_;
            local_1f8._4_4_ = auVar2._4_4_;
            local_208.wd.m_i = local_1f8._0_4_;
            local_208.ht.m_i = local_1f8._4_4_;
            local_1f8 = auVar3;
            QFontMetrics::~QFontMetrics((QFontMetrics *)&local_208);
            QFont::~QFont((QFont *)local_1d8);
          }
          uVar14 = QFontMetrics::size((int)(QFontMetrics *)local_1f8,(QString *)0x0,
                                      (int)pQVar23 + 0x48,(int *)0x0);
          iVar16 = (int)((ulong)uVar14 >> 0x20);
          if (iVar16 < iVar9) {
            iVar16 = iVar9;
          }
          RVar17.m_i = iVar16 + iVar8 * 2;
          iVar16 = iVar8;
          if (cVar6 != '\0') {
            iVar16 = 0;
          }
          lVar25._0_4_ = pQVar23[1].rect.x1;
          lVar25._4_4_ = pQVar23[1].rect.y1;
          iVar22 = 0;
          if (lVar25 != 0) {
            iVar22 = iVar8;
          }
          RVar18.m_i = iVar8 + iVar9 + (int)uVar14 + iVar16 + iVar22;
          if (RVar18.m_i < local_200.wd.m_i) {
            RVar18.m_i = local_200.wd.m_i;
          }
          if (RVar17.m_i < local_200.ht.m_i) {
            RVar17.m_i = local_200.ht.m_i;
          }
          local_200.ht.m_i = RVar17.m_i;
          local_200.wd.m_i = RVar18.m_i;
          QFontMetrics::~QFontMetrics((QFontMetrics *)local_1f8);
        }
        QVar11 = QRenderRule::size((QRenderRule *)local_c8,&local_200);
        QVar12 = QVar11;
      }
      goto LAB_0036a065;
    }
    goto switchD_00368921_caseD_11;
  case CT_MdiControls:
    if (((opt == (QStyleOption *)0x0) || (opt->version < 1)) || (pQVar23 = opt, opt->type < 0xf0000)
       ) {
      pQVar23 = (QStyleOption *)0x0;
    }
    if ((pQVar23 == (QStyleOption *)0x0) ||
       (((bVar5 = hasStyleRule(this,&w->super_QObject,0x3e), !bVar5 &&
         (bVar5 = hasStyleRule(this,&w->super_QObject,0x40), !bVar5)) &&
        (bVar5 = hasStyleRule(this,&w->super_QObject,0x3f), !bVar5)))) {
      bVar5 = false;
    }
    else {
      local_1c8 = &DAT_aaaaaaaaaaaaaaaa;
      pQStack_1d0 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
      local_1d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
      local_1f8._0_4_ = 0xd;
      local_1f8._4_4_ = 0;
      pQStack_1f0 = (QVariant *)0x680130;
      QHash<QString,_QVariant>::value<QLatin1String,_true>
                ((QVariant *)local_c8,&local_150.styleHints,(QLatin1String *)local_1f8);
      ::QVariant::toList();
      ::QVariant::~QVariant((QVariant *)local_c8);
      if (local_1c8 == (undefined1 *)0x0) {
        layout.m_data = "mNX";
        layout.m_size = 3;
        subControlLayout((QList<QVariant> *)local_1f8,layout);
        local_b8._0_8_ = local_1c8;
        local_1c8 = puStack_1e8;
        pQVar4 = pQStack_1f0;
        auVar2 = local_1f8;
        local_1f8._0_4_ = 0;
        local_1f8._4_4_ = 0;
        pQStack_1f0 = (QVariant *)0x0;
        puStack_1e8 = (undefined1 *)0x0;
        local_c8._0_8_ = local_1d8;
        local_c8._8_8_ = pQStack_1d0;
        pQStack_1d0 = (QPalettePrivate *)pQVar4;
        local_1d8 = auVar2;
        QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_c8);
        QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_1f8);
      }
      if (local_1c8 == (undefined1 *)0x0) {
        pQVar24 = (QStyleOption *)0x0;
        QVar11.wd.m_i = 0;
        QVar11.ht.m_i = 0;
      }
      else {
        lVar25 = (long)local_1c8 << 5;
        QVar11.wd.m_i = 0;
        QVar11.ht.m_i = 0;
        uVar21 = 0;
        pQVar19 = pQStack_1d0;
        do {
          pseudoElement = ::QVariant::toInt((bool *)pQVar19);
          if ((pseudoElement - 0x41 < 0xfffffffd) ||
             ((knownPseudoElements[pseudoElement].subControl & pQVar23[1].version) == SC_None)) {
            pQVar24 = (QStyleOption *)(ulong)uVar21;
          }
          else {
            memset((QRenderRule *)local_c8,0xaa,0x88);
            renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,pseudoElement);
            if (local_70.d.ptr == (QStyleSheetGeometryData *)0x0) {
              uVar13 = 0xffffffff;
              if (local_60.d.ptr == (QStyleSheetImageData *)0x0) {
                QVar12.wd.m_i = -1;
                QVar12.ht.m_i = 0;
              }
              else if ((((QSize *)((long)local_60.d.ptr + 0x14))->wd).m_i < 0) {
                QVar12.wd.m_i = -1;
                QVar12.ht.m_i = 0;
              }
              else {
                QVar12.wd.m_i = -1;
                QVar12.ht.m_i = 0;
                if (-1 < ((Representation *)((long)local_60.d.ptr + 0x18))->m_i) {
                  QVar12 = *(QSize *)((long)local_60.d.ptr + 0x14);
                  uVar13 = (ulong)QVar12 >> 0x20;
                }
              }
            }
            else {
              QVar12.ht.m_i = 0;
              QVar12.wd.m_i = *(int *)((long)local_70.d.ptr + 0xc);
              uVar13 = (ulong)(uint)*(int *)((long)local_70.d.ptr + 0x10);
            }
            local_1f8 = (undefined1  [8])((ulong)QVar12 & 0xffffffff | uVar13 << 0x20);
            QVar12 = QRenderRule::boxSize((QRenderRule *)local_c8,(QSize *)local_1f8,7);
            pQVar24 = (QStyleOption *)((ulong)QVar12 >> 0x20);
            if (QVar12.ht.m_i.m_i < (int)uVar21) {
              pQVar24 = (QStyleOption *)(ulong)uVar21;
            }
            QPainterPath::~QPainterPath(local_48);
            QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_58);
            QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_60);
            if (local_68.d.ptr != (QStyleSheetPositionData *)0x0) {
              LOCK();
              *(int *)local_68.d.ptr = *(int *)local_68.d.ptr + -1;
              UNLOCK();
              if ((*(int *)local_68.d.ptr == 0) &&
                 (local_68.d.ptr != (QStyleSheetPositionData *)0x0)) {
                operator_delete((void *)local_68.d.ptr,0x24);
              }
            }
            if (local_70.d.ptr != (QStyleSheetGeometryData *)0x0) {
              LOCK();
              *(int *)local_70.d.ptr = *(int *)local_70.d.ptr + -1;
              UNLOCK();
              if ((*(int *)local_70.d.ptr == 0) &&
                 (local_70.d.ptr != (QStyleSheetGeometryData *)0x0)) {
                operator_delete((void *)local_70.d.ptr,0x1c);
              }
            }
            QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_78);
            QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_80);
            QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_88);
            if (local_90.d.ptr != (QStyleSheetBoxData *)0x0) {
              LOCK();
              *(int *)local_90.d.ptr = *(int *)local_90.d.ptr + -1;
              UNLOCK();
              if ((*(int *)local_90.d.ptr == 0) && (local_90.d.ptr != (QStyleSheetBoxData *)0x0)) {
                operator_delete((void *)local_90.d.ptr,0x28);
              }
            }
            local_218 = QVar12.wd.m_i;
            QVar11.wd.m_i = QVar11.wd.m_i.m_i + local_218.m_i;
            QVar11.ht.m_i = 0;
            QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_98);
            QHash<QString,_QVariant>::~QHash(&local_a0);
            QFont::~QFont(local_b8);
            QBrush::~QBrush((QBrush *)(local_c8 + 8));
          }
          pQVar19 = (QPalettePrivate *)((long)pQVar19 + 0x20);
          uVar21 = (uint)pQVar24;
          lVar25 = lVar25 + -0x20;
        } while (lVar25 != 0);
      }
      QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_1d8);
      bVar5 = true;
      pQVar23 = pQVar24;
    }
    if (!bVar5) goto switchD_00368921_caseD_11;
    goto LAB_00369dd1;
  case CT_ItemViewItem:
    memset((QRenderRule *)local_c8,0xaa,0x88);
    renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,0x4a);
    pQVar10 = baseStyle(this);
    local_200 = (QSize)(**(code **)(*(long *)pQVar10 + 0xe8))(pQVar10,0x16,opt,csz,w);
    local_200 = QRenderRule::adjustSize((QRenderRule *)local_c8,&local_200);
    if (local_80.d.ptr != (QStyleSheetBorderData *)0x0 ||
        local_90.d.ptr != (QStyleSheetBoxData *)0x0) {
      local_200 = QRenderRule::boxSize((QRenderRule *)local_c8,&local_200,7);
    }
    QVar11 = local_200;
    QPainterPath::~QPainterPath(local_48);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_58);
    QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_60);
    if (local_68.d.ptr != (QStyleSheetPositionData *)0x0) {
      LOCK();
      *(int *)local_68.d.ptr = *(int *)local_68.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_68.d.ptr == 0) && (local_68.d.ptr != (QStyleSheetPositionData *)0x0)) {
        operator_delete((void *)local_68.d.ptr,0x24);
      }
    }
joined_r0x0036938a:
    if (local_70.d.ptr != (QStyleSheetGeometryData *)0x0) {
      LOCK();
      (((QStyleSheetGeometryData *)local_70.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>
      .super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
           (__atomic_base<int>)
           ((__int_type)
            (((QStyleSheetGeometryData *)local_70.d.ptr)->super_QSharedData).ref.
            super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int> + -1);
      UNLOCK();
      if (((__int_type)
           (((QStyleSheetGeometryData *)local_70.d.ptr)->super_QSharedData).ref.
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int> == 0) && (local_70.d.ptr != (QStyleSheetGeometryData *)0x0)) {
        operator_delete((void *)local_70.d.ptr,0x1c);
      }
    }
    pQVar23 = (QStyleOption *)((ulong)QVar11 >> 0x20);
    QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_78);
    QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_80);
    QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_88);
    if (local_90.d.ptr != (QStyleSheetBoxData *)0x0) {
      LOCK();
      *(int *)local_90.d.ptr = *(int *)local_90.d.ptr + -1;
      UNLOCK();
      if ((*(int *)local_90.d.ptr == 0) && (local_90.d.ptr != (QStyleSheetBoxData *)0x0)) {
        operator_delete((void *)local_90.d.ptr,0x28);
      }
    }
    QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_98);
    QHash<QString,_QVariant>::~QHash(&local_a0);
    QFont::~QFont(local_b8);
    QBrush::~QBrush((QBrush *)(local_c8 + 8));
    goto LAB_00369dd1;
  }
LAB_00369dcd:
  pQVar23 = (QStyleOption *)((ulong)QVar11 >> 0x20);
LAB_00369dd1:
  QPainterPath::~QPainterPath(&local_150.clipPath);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_150.iconPtr);
  QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_150.img);
  if (local_150.p.d.ptr != (QStyleSheetPositionData *)0x0) {
    LOCK();
    *(int *)local_150.p.d.ptr = *(int *)local_150.p.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_150.p.d.ptr == 0) && (local_150.p.d.ptr != (QStyleSheetPositionData *)0x0)) {
      operator_delete((void *)local_150.p.d.ptr,0x24);
    }
  }
  if (local_150.geo.d.ptr != (QStyleSheetGeometryData *)0x0) {
    LOCK();
    *(int *)local_150.geo.d.ptr = *(int *)local_150.geo.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_150.geo.d.ptr == 0) &&
       (local_150.geo.d.ptr != (QStyleSheetGeometryData *)0x0)) {
      operator_delete((void *)local_150.geo.d.ptr,0x1c);
    }
  }
  QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_150.ou);
  QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_150.bd);
  QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_150.bg);
  if (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0) {
    LOCK();
    *(int *)local_150.b.d.ptr = *(int *)local_150.b.d.ptr + -1;
    UNLOCK();
    if ((*(int *)local_150.b.d.ptr == 0) && (local_150.b.d.ptr != (QStyleSheetBoxData *)0x0)) {
      operator_delete((void *)local_150.b.d.ptr,0x28);
    }
  }
  QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_150.pal);
  QHash<QString,_QVariant>::~QHash(&local_150.styleHints);
  QFont::~QFont(&local_150.font);
  QBrush::~QBrush(&local_150.defaultBackground);
  if (pQVar1 == (QStyleSheetStyle *)0x0) {
    globalStyleSheetStyle = (QStyleSheetStyle *)0x0;
  }
LAB_00369edc:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (QSize)((ulong)QVar11 & 0xffffffff | (long)pQVar23 << 0x20);
switchD_00368921_caseD_0:
  if ((local_150.b.d.ptr == (QStyleSheetBoxData *)0x0) &&
     ((local_150.bd.d.ptr == (QStyleSheetBorderData *)0x0 ||
      (((((QSharedDataPointer<QStyleSheetBorderImageData> *)((long)local_150.bd.d.ptr + 0x68))->d).
        ptr == (QStyleSheetBorderImageData *)0x0 &&
       (*(BorderStyle *)((long)local_150.bd.d.ptr + 0x38) == BorderStyle_Native)))))) {
    bVar5 = QRenderRule::baseStyleCanDraw(&local_150);
    if (bVar5) {
      pQVar10 = baseStyle(this);
      local_200 = (QSize)(**(code **)(*(long *)pQVar10 + 0xe8))(pQVar10,ct,opt,&local_200,w);
    }
    else {
      local_200 = QWindowsStyle::sizeFromContents((QWindowsStyle *)this,ct,opt,&local_200,w);
    }
    iVar8 = 9;
  }
  else {
    if (ct == CT_ComboBox) {
      memset((QRenderRule *)local_c8,0xaa,0x88);
      renderRule((QRenderRule *)local_c8,this,&w->super_QObject,opt,8);
      QVar26 = positionRect(this,w,&local_150,(QRenderRule *)local_c8,8,&opt->rect,opt->direction);
      local_200.wd.m_i = ((QVar26.x2.m_i.m_i + local_200.wd.m_i) - QVar26.x1.m_i) + 3;
      QPainterPath::~QPainterPath(local_48);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(local_58);
      QSharedDataPointer<QStyleSheetImageData>::~QSharedDataPointer(&local_60);
      if (local_68.d.ptr != (QStyleSheetPositionData *)0x0) {
        LOCK();
        *(int *)local_68.d.ptr = *(int *)local_68.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_68.d.ptr == 0) && (local_68.d.ptr != (QStyleSheetPositionData *)0x0)) {
          operator_delete((void *)local_68.d.ptr,0x24);
        }
      }
      if (local_70.d.ptr != (QStyleSheetGeometryData *)0x0) {
        LOCK();
        *(int *)local_70.d.ptr = *(int *)local_70.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_70.d.ptr == 0) && (local_70.d.ptr != (QStyleSheetGeometryData *)0x0)) {
          operator_delete((void *)local_70.d.ptr,0x1c);
        }
      }
      QSharedDataPointer<QStyleSheetOutlineData>::~QSharedDataPointer(&local_78);
      QSharedDataPointer<QStyleSheetBorderData>::~QSharedDataPointer(&local_80);
      QSharedDataPointer<QStyleSheetBackgroundData>::~QSharedDataPointer(&local_88);
      if (local_90.d.ptr != (QStyleSheetBoxData *)0x0) {
        LOCK();
        *(int *)local_90.d.ptr = *(int *)local_90.d.ptr + -1;
        UNLOCK();
        if ((*(int *)local_90.d.ptr == 0) && (local_90.d.ptr != (QStyleSheetBoxData *)0x0)) {
          operator_delete((void *)local_90.d.ptr,0x28);
        }
      }
      QSharedDataPointer<QStyleSheetPaletteData>::~QSharedDataPointer(&local_98);
      QHash<QString,_QVariant>::~QHash(&local_a0);
      QFont::~QFont(local_b8);
      QBrush::~QBrush((QBrush *)(local_c8 + 8));
    }
LAB_0036970d:
    iVar8 = 7;
  }
  QVar11 = QRenderRule::boxSize(&local_150,&local_200,iVar8);
  goto LAB_00369dcd;
}

Assistant:

QSize QStyleSheetStyle::sizeFromContents(ContentsType ct, const QStyleOption *opt,
                                         const QSize &csz, const QWidget *w) const
{
    RECURSION_GUARD(return baseStyle()->sizeFromContents(ct, opt, csz, w))

    QRenderRule rule = renderRule(w, opt);
    QSize sz = rule.adjustSize(csz);

    switch (ct) {
#if QT_CONFIG(spinbox)
    case CT_SpinBox:
        if (const QStyleOptionSpinBox *spinbox = qstyleoption_cast<const QStyleOptionSpinBox *>(opt)) {
            if (rule.baseStyleCanDraw()) {
                sz = baseStyle()->sizeFromContents(ct, opt, sz, w);
            } else if (spinbox->buttonSymbols != QAbstractSpinBox::NoButtons) {
                // Add some space for the up/down buttons
                QRenderRule subRule = renderRule(w, opt, PseudoElement_SpinBoxUpButton);
                if (subRule.hasDrawable()) {
                    QRect r = positionRect(w, rule, subRule, PseudoElement_SpinBoxUpButton,
                                           opt->rect, opt->direction);
                    sz.rwidth() += r.width();
                } else {
                    QSize defaultUpSize = defaultSize(w, subRule.size(), spinbox->rect, PseudoElement_SpinBoxUpButton);
                    sz.rwidth() += defaultUpSize.width();
                }
            }
            if (rule.hasBox() || rule.hasBorder() || !rule.hasNativeBorder())
                sz = rule.boxSize(sz);
            return sz;
        }
        break;
#endif // QT_CONFIG(spinbox)
    case CT_ToolButton:
        if (rule.hasBox() || !rule.hasNativeBorder() || !rule.baseStyleCanDraw())
            sz += QSize(3, 3); // ### broken QToolButton
        Q_FALLTHROUGH();
    case CT_ComboBox:
    case CT_PushButton:
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            if (ct == CT_ComboBox) {
                //add some space for the drop down.
                QRenderRule subRule = renderRule(w, opt, PseudoElement_ComboBoxDropDown);
                QRect comboRect = positionRect(w, rule, subRule, PseudoElement_ComboBoxDropDown, opt->rect, opt->direction);
                //+2 because there is hardcoded margins in QCommonStyle::drawControl(CE_ComboBoxLabel)
                sz += QSize(comboRect.width() + 2, 0);
            }
            return rule.boxSize(sz);
        }
        sz = rule.baseStyleCanDraw() ? baseStyle()->sizeFromContents(ct, opt, sz, w)
                                     : QWindowsStyle::sizeFromContents(ct, opt, sz, w);
        return rule.boxSize(sz, Margin);

    case CT_HeaderSection: {
            if (const QStyleOptionHeader *hdr = qstyleoption_cast<const QStyleOptionHeader *>(opt)) {
                QRenderRule subRule = renderRule(w, opt, PseudoElement_HeaderViewSection);
                if (subRule.hasGeometry() || subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
                    sz = subRule.adjustSize(csz);
                    if (!sz.isValid()) {
                        // Try to set the missing values based on the base style.
                        const auto baseSize = baseStyle()->sizeFromContents(ct, opt, sz, w);
                        if (sz.width() < 0)
                            sz.setWidth(baseSize.width());
                        if (sz.height() < 0)
                            sz.setHeight(baseSize.height());
                    }
                    if (!subRule.hasGeometry()) {
                        QSize nativeContentsSize;
                        bool nullIcon = hdr->icon.isNull();
                        const int margin = pixelMetric(QStyle::PM_HeaderMargin, hdr, w);
                        int iconSize = nullIcon ? 0 : pixelMetric(QStyle::PM_SmallIconSize, hdr, w);
                        QFontMetrics fm = hdr->fontMetrics;
                        if (subRule.hasFont) {
                            QFont styleFont = w ? subRule.font.resolve(w->font()) : subRule.font;
                            fm = QFontMetrics(styleFont);
                        }
                        const QSize txt = fm.size(0, hdr->text);
                        nativeContentsSize.setHeight(margin + qMax(iconSize, txt.height()) + margin);
                        nativeContentsSize.setWidth((nullIcon ? 0 : margin) + iconSize
                                                    + (hdr->text.isNull() ? 0 : margin) + txt.width() + margin);
                        sz = sz.expandedTo(nativeContentsSize);
                    }
                    return subRule.size(sz);
                }
                sz = subRule.baseStyleCanDraw() ? baseStyle()->sizeFromContents(ct, opt, sz, w)
                                                : QWindowsStyle::sizeFromContents(ct, opt, sz, w);
                if (hasStyleRule(w, PseudoElement_HeaderViewDownArrow)
                 || hasStyleRule(w, PseudoElement_HeaderViewUpArrow)) {
                    const QRect arrowRect = subElementRect(SE_HeaderArrow, opt, w);
                    if (hdr->orientation == Qt::Horizontal)
                        sz.rwidth() += arrowRect.width();
                    else
                        sz.rheight() += arrowRect.height();
                }
                return sz;
            }
        }
        break;
    case CT_GroupBox:
    case CT_LineEdit:
#if QT_CONFIG(spinbox)
        if (qobject_cast<QAbstractSpinBox *>(w ? w->parentWidget() : nullptr))
            return csz; // we only care about the size hint of the line edit
#endif
        if (rule.hasBox() || !rule.hasNativeBorder()) {
            return rule.boxSize(sz);
        }
        break;

    case CT_CheckBox:
    case CT_RadioButton:
        if (const QStyleOptionButton *btn = qstyleoption_cast<const QStyleOptionButton *>(opt)) {
            if (rule.hasBox() || rule.hasBorder() || hasStyleRule(w, PseudoElement_Indicator)) {
                bool isRadio = (ct == CT_RadioButton);
                int iw = pixelMetric(isRadio ? PM_ExclusiveIndicatorWidth
                                             : PM_IndicatorWidth, btn, w);
                int ih = pixelMetric(isRadio ? PM_ExclusiveIndicatorHeight
                                             : PM_IndicatorHeight, btn, w);

                int spacing = pixelMetric(isRadio ? PM_RadioButtonLabelSpacing
                                                  : PM_CheckBoxLabelSpacing, btn, w);
                sz.setWidth(sz.width() + iw + spacing);
                sz.setHeight(qMax(sz.height(), ih));
                return rule.boxSize(sz);
            }
        }
        break;

    case CT_Menu:
    case CT_MenuBar: // already has everything!
    case CT_ScrollBar:
        if (rule.hasBox() || rule.hasBorder())
            return sz;
        break;

    case CT_MenuItem:
        if (const QStyleOptionMenuItem *mi = qstyleoption_cast<const QStyleOptionMenuItem *>(opt)) {
            PseudoElement pe = (mi->menuItemType == QStyleOptionMenuItem::Separator)
                                    ? PseudoElement_MenuSeparator : PseudoElement_Item;
            QRenderRule subRule = renderRule(w, opt, pe);
            if ((pe == PseudoElement_MenuSeparator) && subRule.hasContentsSize()) {
                return QSize(sz.width(), subRule.size().height());
            }
            if ((pe == PseudoElement_Item) && (subRule.hasBox() || subRule.hasBorder() || subRule.hasFont)) {
                bool drawCheckMark = mi->menuHasCheckableItems;
#if QT_CONFIG(combobox)
                if (qobject_cast<const QComboBox *>(w))
                    drawCheckMark = false; // ignore the checkmarks provided by the QComboMenuDelegate
#endif
                QSize sz(csz);
                if (subRule.hasFont) {
                    QFontMetrics fm(subRule.font.resolve(mi->font));
                    const QRect r = fm.boundingRect(QRect(), Qt::TextSingleLine | Qt::TextShowMnemonic, mi->text);
                    sz = sz.expandedTo(r.size());
                }
                if (mi->text.contains(u'\t'))
                    sz.rwidth() += 12; //as in QCommonStyle
                if (!mi->icon.isNull()) {
                    const int pmSmall = pixelMetric(PM_SmallIconSize);
                    const QSize pmSize = mi->icon.actualSize(QSize(pmSmall, pmSmall));
                    sz.rwidth() += std::max(mi->maxIconWidth, pmSize.width()) + 4;
                } else if (drawCheckMark) {
                    QRenderRule subSubRule = renderRule(w, opt, PseudoElement_MenuCheckMark);
                    QRect checkmarkRect = positionRect(w, subRule, subSubRule, PseudoElement_MenuCheckMark, opt->rect, opt->direction);
                    sz.rwidth() += std::max(mi->maxIconWidth, checkmarkRect.width()) + 4;
                } else {
                    sz.rwidth() += mi->maxIconWidth;
                }
                return subRule.boxSize(subRule.adjustSize(sz));
            }
        }
        break;

    case CT_Splitter:
    case CT_MenuBarItem: {
        PseudoElement pe = (ct == CT_Splitter) ? PseudoElement_SplitterHandle : PseudoElement_Item;
        QRenderRule subRule = renderRule(w, opt, pe);
        if (subRule.hasBox() || subRule.hasBorder())
            return subRule.boxSize(sz);
        break;
                        }

    case CT_ProgressBar:
    case CT_SizeGrip:
        return (rule.hasContentsSize())
            ? rule.size(sz)
            : rule.boxSize(baseStyle()->sizeFromContents(ct, opt, sz, w));
        break;

    case CT_Slider:
        if (rule.hasBorder() || rule.hasBox() || rule.hasGeometry())
            return rule.boxSize(sz);
        break;

#if QT_CONFIG(tabbar)
    case CT_TabBarTab: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_TabBarTab);
        if (subRule.hasBox() || !subRule.hasNativeBorder() || subRule.hasFont) {
            int spaceForIcon = 0;
            bool vertical = false;
            QString text;
            if (const QStyleOptionTab *tab = qstyleoption_cast<const QStyleOptionTab *>(opt)) {
                if (!tab->icon.isNull())
                    spaceForIcon = 6 /* icon offset */ + 4 /* spacing */ + 2 /* magic */; // ###: hardcoded to match with common style
                vertical = verticalTabs(tab->shape);
                text = tab->text;
            }
            if (subRule.hasBox() || !subRule.hasNativeBorder())
                sz = csz + QSize(vertical ? 0 : spaceForIcon, vertical ? spaceForIcon : 0);
            if (subRule.hasFont) {
                // first we remove the space needed for the text using the default font
                const QSize oldTextSize = opt->fontMetrics.size(Qt::TextShowMnemonic, text);
                (vertical ? sz.rheight() : sz.rwidth()) -= oldTextSize.width();

                // then we add the space needed when using the rule font to the relevant
                // dimension, and constraint the other dimension to the maximum to make
                // sure we don't grow, but also don't clip icons or buttons.
                const QFont ruleFont = subRule.font.resolve(w->font());
                const QFontMetrics fm(ruleFont);
                const QSize textSize = fm.size(Qt::TextShowMnemonic, text);
                if (vertical) {
                    sz.rheight() += textSize.width();
                    sz.rwidth() = qMax(textSize.height(), sz.width());
                } else {
                    sz.rwidth() += textSize.width();
                    sz.rheight() = qMax(textSize.height(), sz.height());
                }
            }

            return subRule.boxSize(subRule.adjustSize(sz));
        }
        sz = subRule.adjustSize(csz);
        break;
    }
#endif // QT_CONFIG(tabbar)

    case CT_MdiControls:
        if (const QStyleOptionComplex *ccOpt = qstyleoption_cast<const QStyleOptionComplex *>(opt)) {
            if (!hasStyleRule(w, PseudoElement_MdiCloseButton)
                && !hasStyleRule(w, PseudoElement_MdiNormalButton)
                && !hasStyleRule(w, PseudoElement_MdiMinButton))
                break;

            QList<QVariant> layout = rule.styleHint("button-layout"_L1).toList();
            if (layout.isEmpty())
                layout = subControlLayout("mNX");

            int width = 0, height = 0;
            for (const QVariant &val : std::as_const(layout)) {
                int layoutButton = val.toInt();
                if (layoutButton < PseudoElement_MdiCloseButton
                    || layoutButton > PseudoElement_MdiNormalButton)
                    continue;
                QStyle::SubControl sc = knownPseudoElements[layoutButton].subControl;
                if (!(ccOpt->subControls & sc))
                    continue;
                QRenderRule subRule = renderRule(w, opt, layoutButton);
                QSize sz = subRule.size();
                width += sz.width();
                height = qMax(height, sz.height());
            }

            return QSize(width, height);
        }
        break;

#if QT_CONFIG(itemviews)
    case CT_ItemViewItem: {
        QRenderRule subRule = renderRule(w, opt, PseudoElement_ViewItem);
        sz = baseStyle()->sizeFromContents(ct, opt, csz, w);
        sz = subRule.adjustSize(sz);
        if (subRule.hasBox() || subRule.hasBorder())
            sz = subRule.boxSize(sz);
        return sz;
                      }
#endif // QT_CONFIG(itemviews)

    default:
        break;
    }

    return baseStyle()->sizeFromContents(ct, opt, sz, w);
}